

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O0

void __thiscall Lodtalk::GarbageCollector::abortCompaction(GarbageCollector *this)

{
  bool bVar1;
  VMHeap *this_00;
  size_t sVar2;
  AllocatedObject *pAVar3;
  ObjectHeader *pOVar4;
  anon_union_8_4_0eb573b0_for_Oop_0 *paVar5;
  Oop *nativeObject;
  iterator __end1;
  iterator __begin1;
  vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_> *__range1;
  size_t liveSize;
  AllocatedObject *liveHeader;
  uint8_t *live;
  uint8_t *endAddress;
  uint8_t *lowestAddress;
  VMHeap *heap;
  GarbageCollector *this_local;
  
  this_00 = MemoryManager::getHeap(this->memoryManager);
  liveHeader = (AllocatedObject *)VMHeap::getAddressSpace(this_00);
  sVar2 = VMHeap::getSize(this_00);
  pAVar3 = (AllocatedObject *)((long)&liveHeader->rawForwardingPointer + sVar2);
  for (; liveHeader < pAVar3;
      liveHeader = (AllocatedObject *)((long)&liveHeader->rawForwardingPointer + sVar2)) {
    sVar2 = AllocatedObject::computeSize(liveHeader);
    pOVar4 = AllocatedObject::header(liveHeader);
    *pOVar4 = (ObjectHeader)((ulong)*pOVar4 & 0xfffffff8ffffffff);
  }
  if (liveHeader == pAVar3) {
    __end1 = std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::begin(&this->nativeObjects);
    nativeObject = (Oop *)std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::end
                                    (&this->nativeObjects);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<Lodtalk::Oop_*,_std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>_>
                                  *)&nativeObject);
      if (!bVar1) break;
      paVar5 = &__gnu_cxx::
                __normal_iterator<Lodtalk::Oop_*,_std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>_>
                ::operator*(&__end1)->field_0;
      *paVar5->header = (ObjectHeader)(*(ulong *)paVar5->header & 0xfffffff8ffffffff);
      __gnu_cxx::
      __normal_iterator<Lodtalk::Oop_*,_std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>_>::
      operator++(&__end1);
    }
    return;
  }
  __assert_fail("live == endAddress",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/MemoryManager.cpp"
                ,0x26b,"void Lodtalk::GarbageCollector::abortCompaction()");
}

Assistant:

void GarbageCollector::abortCompaction()
{
    auto heap = memoryManager->getHeap();
    auto lowestAddress = heap->getAddressSpace();
    auto endAddress = lowestAddress + heap->getSize();

    auto live = lowestAddress;
    while(live < endAddress)
    {
        auto liveHeader = reinterpret_cast<AllocatedObject*> (live);
        auto liveSize = liveHeader->computeSize();

        // Set the color to white.
        liveHeader->header().gcColor = White;

        // Process the next object.
        live += liveSize;
    }
    assert(live == endAddress);

    // Set the white color of the native objects.
    for(auto &nativeObject : nativeObjects)
        nativeObject.header->gcColor = White;
}